

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Content-Type",&local_49);
  get_header_value(&local_28,this,&local_48,"",0);
  std::__cxx11::string::~string((string *)&local_48);
  lVar1 = std::__cxx11::string::rfind((char *)&local_28,0x214521);
  std::__cxx11::string::~string((string *)&local_28);
  return lVar1 == 0;
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}